

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O0

uint32_t __thiscall cppnet::BufferBlock::GetCanWriteLength(BufferBlock *this)

{
  BufferBlock *this_local;
  
  if (this->_read < this->_write) {
    this_local._4_4_ =
         ((int)this->_buffer_end - (int)this->_write) +
         ((int)this->_read - (int)this->_buffer_start);
  }
  else if (this->_write < this->_read) {
    this_local._4_4_ = (int)this->_read - (int)this->_write;
  }
  else if ((this->_can_read & 1U) == 0) {
    this_local._4_4_ = this->_total_size;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t BufferBlock::GetCanWriteLength() {
    if (_write > _read) {
        return (uint32_t)((_buffer_end - _write) + (_read - _buffer_start));
    
    } else if (_write < _read) {
        return (uint32_t)((_read - _write));

    } else {
        if (_can_read) {
            return 0;
        
        } else {
            return _total_size;
        }
    }
}